

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

int32_t utrie_getDataBlock(UNewTrie *trie,UChar32 c)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  
  iVar2 = trie->index[(uint)c >> 5];
  lVar3 = (long)iVar2;
  if (lVar3 < 1) {
    uVar1 = trie->dataLength;
    iVar2 = -1;
    if (((int)(uVar1 + 0x20) <= trie->dataCapacity) &&
       (trie->dataLength = uVar1 + 0x20, -1 < (int)uVar1)) {
      trie->index[(uint)c >> 5] = uVar1;
      puVar5 = trie->data + -lVar3;
      puVar6 = trie->data + uVar1;
      for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *puVar5;
        puVar5 = puVar5 + 1;
        puVar6 = puVar6 + 1;
      }
      return uVar1;
    }
  }
  return iVar2;
}

Assistant:

static int32_t
utrie_getDataBlock(UNewTrie *trie, UChar32 c) {
    int32_t indexValue, newBlock;

    c>>=UTRIE_SHIFT;
    indexValue=trie->index[c];
    if(indexValue>0) {
        return indexValue;
    }

    /* allocate a new data block */
    newBlock=utrie_allocDataBlock(trie);
    if(newBlock<0) {
        /* out of memory in the data array */
        return -1;
    }
    trie->index[c]=newBlock;

    /* copy-on-write for a block from a setRange() */
    uprv_memcpy(trie->data+newBlock, trie->data-indexValue, 4*UTRIE_DATA_BLOCK_LENGTH);
    return newBlock;
}